

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteVFormatComment(xmlTextWriterPtr writer,char *format,__va_list_tag *argptr)

{
  int iVar1;
  xmlChar *content;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterWriteVFormatComment : invalid writer!\n");
  }
  else {
    content = xmlTextWriterVSprintf(format,argptr);
    if (content != (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteComment(writer,content);
      (*xmlFree)(content);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteVFormatComment(xmlTextWriterPtr writer,
                                 const char *format, va_list argptr)
{
    int rc;
    xmlChar *buf;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteVFormatComment : invalid writer!\n");
        return -1;
    }

    buf = xmlTextWriterVSprintf(format, argptr);
    if (buf == NULL)
        return -1;

    rc = xmlTextWriterWriteComment(writer, buf);

    xmlFree(buf);
    return rc;
}